

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * base64_decode(string *__return_storage_ptr__,string *encoded_string)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  
  iVar5 = (int)encoded_string->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar7 = 0;
  iVar4 = 0;
  while( true ) {
    lVar6 = (long)iVar4;
    bVar9 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar9) break;
    bVar1 = (encoded_string->_M_dataplus)._M_p[lVar7];
    if ((bVar1 == 0x3d) || ((iVar3 = isalnum((uint)bVar1), (bVar1 & 0xfb) != 0x2b && (iVar3 == 0))))
    break;
    iVar4 = iVar4 + 1;
    char_array_4[lVar6] = bVar1;
    lVar7 = lVar7 + 1;
    if (iVar4 == 4) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        uVar2 = std::__cxx11::string::find('8',(ulong)(uint)(int)(char)char_array_4[lVar6]);
        char_array_4[lVar6] = uVar2;
      }
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      iVar4 = 0;
    }
  }
  if (iVar4 != 0) {
    for (; lVar6 < 4; lVar6 = lVar6 + 1) {
      char_array_4[lVar6] = '\0';
    }
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      uVar2 = std::__cxx11::string::find('8',(ulong)(uint)(int)(char)char_array_4[lVar7]);
      char_array_4[lVar7] = uVar2;
    }
    iVar5 = 1;
    if (1 < iVar4) {
      iVar5 = iVar4;
    }
    for (uVar8 = 0; iVar5 - 1 != uVar8; uVar8 = uVar8 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_decode(std::string const& encoded_string) {
    int in_len = encoded_string.size();
    int i = 0;
    int j = 0;
    int in_ = 0;
    unsigned char char_array_4[4], char_array_3[3];
    std::string ret;

    while (in_len-- && ( encoded_string[in_] != '=') && is_base64(encoded_string[in_])) {
        char_array_4[i++] = encoded_string[in_]; in_++;
        if (i ==4) {
            for (i = 0; i <4; i++)
                char_array_4[i] = base64_chars.find(char_array_4[i]);

            char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
            char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
            char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

            for (i = 0; (i < 3); i++)
                ret += char_array_3[i];
            i = 0;
        }
    }

    if (i) {
        for (j = i; j <4; j++)
            char_array_4[j] = 0;

        for (j = 0; j <4; j++)
            char_array_4[j] = base64_chars.find(char_array_4[j]);

        char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
        char_array_3[1] = ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
        char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

        for (j = 0; (j < i - 1); j++) ret += char_array_3[j];
    }

    return ret;
}